

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O2

int evutil_date_rfc1123(char *date,size_t datelen,tm *tm)

{
  int iVar1;
  time_t t;
  tm sys;
  
  t = time((time_t *)0x0);
  if (tm == (tm *)0x0) {
    tm = &sys;
    gmtime_r(&t,(tm *)tm);
  }
  iVar1 = evutil_snprintf(date,datelen,"%s, %02d %s %4d %02d:%02d:%02d GMT",
                          evutil_date_rfc1123_DAYS_rel +
                          *(int *)(evutil_date_rfc1123_DAYS_rel + (long)((tm *)tm)->tm_wday * 4),
                          (ulong)(uint)((tm *)tm)->tm_mday,
                          evutil_date_rfc1123_MONTHS_rel +
                          *(int *)(evutil_date_rfc1123_MONTHS_rel + (long)((tm *)tm)->tm_mon * 4),
                          (ulong)(((tm *)tm)->tm_year + 0x76c),(ulong)(uint)((tm *)tm)->tm_hour,
                          (ulong)(uint)((tm *)tm)->tm_min,(ulong)(uint)((tm *)tm)->tm_sec);
  return iVar1;
}

Assistant:

int
evutil_date_rfc1123(char *date, const size_t datelen, const struct tm *tm)
{
	static const char *DAYS[] =
		{ "Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat" };
	static const char *MONTHS[] =
		{ "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };

	time_t t = time(NULL);

#ifndef _WIN32
	struct tm sys;
#endif

	/* If `tm` is null, set system's current time. */
	if (tm == NULL) {
#ifdef _WIN32
		/** TODO: detect _gmtime64()/_gmtime64_s() */
		tm = gmtime(&t);
#else
		gmtime_r(&t, &sys);
		tm = &sys;
#endif
	}

	return evutil_snprintf(
		date, datelen, "%s, %02d %s %4d %02d:%02d:%02d GMT",
		DAYS[tm->tm_wday], tm->tm_mday, MONTHS[tm->tm_mon],
		1900 + tm->tm_year, tm->tm_hour, tm->tm_min, tm->tm_sec);
}